

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdantzigpr.hpp
# Opt level: O3

SPxId __thiscall
soplex::SPxDantzigPR<double>::selectEnterDenseDim
          (SPxDantzigPR<double> *this,double *best,SPxId *enterId)

{
  double dVar1;
  SPxSolverBase<double> *this_00;
  bool bVar2;
  DataKey DVar3;
  ulong uVar4;
  double dVar5;
  
  uVar4 = (ulong)(((this->super_SPxPricer<double>).thesolver)->thecovectors->set).thenum;
  if (0 < (long)uVar4) {
    dVar5 = *best;
    do {
      this_00 = (this->super_SPxPricer<double>).thesolver;
      dVar1 = (this_00->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar4 - 1];
      if ((dVar1 < -(this->super_SPxPricer<double>).thetolerance) && (dVar1 < dVar5)) {
        DVar3 = (DataKey)SPxSolverBase<double>::coId(this_00,(int)uVar4 + -1);
        enterId->super_DataKey = DVar3;
        *best = dVar1;
        dVar5 = dVar1;
      }
      bVar2 = 1 < uVar4;
      uVar4 = uVar4 - 1;
    } while (bVar2);
  }
  return (SPxId)enterId->super_DataKey;
}

Assistant:

SPxId SPxDantzigPR<R>::selectEnterDenseDim(R& best, SPxId& enterId)
{
   assert(this->thesolver != nullptr);

   R x;

   for(int i = this->thesolver->dim() - 1; i >= 0; --i)
   {
      x = this->thesolver->coTest()[i];

      if(x < -this->thetolerance)
      {
         if(x < best)
         {
            enterId   = this->thesolver->coId(i);
            best = x;
         }
      }
   }

   return enterId;
}